

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O3

int __thiscall CharFieldSourceByteArray::arraylen(CharFieldSourceByteArray *this,CVmPackType *t)

{
  wchar_t wVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  wVar1 = t->type_code;
  iVar2 = 0;
  if (wVar1 < L'a') {
    if (wVar1 < L'U') {
      if (wVar1 == L'A') goto LAB_002ab364;
      if (wVar1 != L'H') {
        return 0;
      }
      goto LAB_002ab351;
    }
    if (wVar1 != L'U') {
      if (wVar1 != L'W') {
        return 0;
      }
      goto LAB_002ab37e;
    }
  }
  else {
    if (wVar1 < L'u') {
      if ((uint)(wVar1 + L'\xffffff9f') < 2) {
LAB_002ab364:
        return (int)this->len;
      }
      if (wVar1 != L'h') {
        return 0;
      }
LAB_002ab351:
      iVar2 = (int)(this->len + 1 >> 1);
      if (t->count_in_bytes == 0) {
        iVar2 = (int)this->len;
      }
      return iVar2;
    }
    if (wVar1 != L'u') {
      if (wVar1 != L'w') {
        return 0;
      }
LAB_002ab37e:
      return (int)this->len << (t->count_in_bytes != 0);
    }
  }
  if (this->len != 0) {
    uVar4 = this->len + 1;
    uVar3 = 2;
    if (2 < uVar4) {
      uVar3 = uVar4;
    }
    uVar4 = 0;
    iVar2 = 0;
    do {
      iVar2 = (iVar2 - (uint)(-1 < *(char *)(*(long *)(*(long *)((this->arr->super_CVmObject).ext_ +
                                                                (uVar4 >> 0x1c) * 8 + 4) +
                                                      (ulong)((uint)(uVar4 >> 0xc) & 0xfff8)) +
                                            (ulong)((uint)uVar4 & 0x7fff)))) + 2;
      uVar4 = uVar4 + 1;
    } while (uVar3 - 1 != uVar4);
  }
  return iVar2;
}

Assistant:

virtual int arraylen(CVmPackType *t)
    {
        switch (t->type_code)
        {
        case 'a':
        case 'A':
        case 'b':
            /* 
             *   the length is in bytes, and we write one byte per character;
             *   we treat each byte in the array as a Latin-1 character, so
             *   this is the same as our array length 
             */
            return (int)len;

        case 'w':
        case 'W':
            /* 
             *   The length is in characters, or two bytes per character.  We
             *   treat our bytes as latin-1 characters, so the character
             *   count is the saqme as the array length. 
             */
            return (int)(t->count_in_bytes ? len*2 : len);
            
        case 'h':
        case 'H':
            /* 
             *   one character per array element, or one byte per pair of
             *   array elements 
             */
            return (int)(t->count_in_bytes ? (len+1)/2 : len);

        case 'u':
        case 'U':
            /* 
             *   The length is in bytes, in UTF-8 format.  We treat our array
             *   elements as Latin-1 characters.  In UTF-8, characters in the
             *   range 0-127 take one byte, and 128-255 take two bytes.  Run
             *   through our array and add up the required lengths.  
             */
            {
                int ret;
                unsigned long i;
                for (ret = 0, i = 1 ; i <= len ; ++i)
                    ret += arr->get_element(i) < 128 ? 1 : 2;

                /* return the length */
                return ret;
            }

        default:
            return 0;
        }
    }